

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_test.cxx
# Opt level: O0

int serialization_test::srv_config_test(void)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  element_type *peVar4;
  string *psVar5;
  ostream *poVar6;
  size_t sVar7;
  void *pvVar8;
  int32 _v_1;
  int32 _ev_1;
  string _v;
  string _ev;
  ptr<srv_config> srv_conf1;
  ptr<buffer> srv_conf_buf;
  ptr<srv_config> srv_conf;
  undefined4 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  strfmt<100> *in_stack_fffffffffffffc20;
  int *in_stack_fffffffffffffc28;
  buffer *in_stack_fffffffffffffc38;
  srv_config *in_stack_fffffffffffffc48;
  string local_168 [36];
  int32 local_144;
  int32 local_140;
  uint local_13c;
  native_handle_type local_138;
  char local_12d;
  int local_12c;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [80];
  strfmt<100> local_98;
  char *local_28;
  int32 local_1c;
  int local_4;
  
  local_1c = rnd();
  nuraft::strfmt<100>::strfmt(&local_98,"server %d");
  rnd();
  local_28 = nuraft::strfmt<100>::fmt<int>(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
  nuraft::cs_new<nuraft::srv_config,int,char_const*>
            (in_stack_fffffffffffffc28,(char **)in_stack_fffffffffffffc20);
  std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x107c9d);
  nuraft::srv_config::serialize(in_stack_fffffffffffffc48);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffc20);
  nuraft::srv_config::deserialize(in_stack_fffffffffffffc38);
  peVar4 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x107cdb);
  psVar5 = nuraft::srv_config::get_endpoint_abi_cxx11_(peVar4);
  std::__cxx11::string::string(local_e8,(string *)psVar5);
  peVar4 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x107d11);
  psVar5 = nuraft::srv_config::get_endpoint_abi_cxx11_(peVar4);
  std::__cxx11::string::string(local_108,(string *)psVar5);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffc20,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  if (bVar1) {
    poVar6 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"        time: ");
    poVar6 = std::operator<<(poVar6,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar6 = std::operator<<(poVar6,local_128);
    poVar6 = std::operator<<(poVar6,"\x1b[0m");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"      thread: ");
    poVar6 = std::operator<<(poVar6,"\x1b[33m");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
    local_12c = (int)std::setw(4);
    poVar6 = std::operator<<(poVar6,(_Setw)local_12c);
    local_12d = (char)std::setfill<char>('0');
    poVar6 = std::operator<<(poVar6,local_12d);
    local_138 = (native_handle_type)std::this_thread::get_id();
    sVar7 = std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)in_stack_fffffffffffffc20,
                       (id *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    pvVar8 = (void *)std::ostream::operator<<(poVar6,sVar7 & 0xffff);
    poVar6 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
    poVar6 = std::operator<<(poVar6,"\x1b[0m");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"          in: ");
    poVar6 = std::operator<<(poVar6,"\x1b[36m");
    poVar6 = std::operator<<(poVar6,"srv_config_test");
    poVar6 = std::operator<<(poVar6,"()\x1b[0m");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"          at: ");
    poVar6 = std::operator<<(poVar6,"\x1b[32m");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/serialization_test.cxx"
                            );
    poVar6 = std::operator<<(poVar6,"\x1b[0m:");
    poVar6 = std::operator<<(poVar6,"\x1b[1;35m");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x38);
    poVar6 = std::operator<<(poVar6,"\x1b[0m");
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"    value of: \x1b[1;34msrv_conf1->get_endpoint()\x1b[0m\n");
    poVar6 = std::operator<<(poVar6,"    expected: \x1b[1;32m");
    poVar6 = std::operator<<(poVar6,local_e8);
    poVar6 = std::operator<<(poVar6,"\x1b[0m\n");
    poVar6 = std::operator<<(poVar6,"      actual: \x1b[1;31m");
    poVar6 = std::operator<<(poVar6,local_108);
    std::operator<<(poVar6,"\x1b[0m\n");
    std::__cxx11::string::~string(local_128);
    TestSuite::failHandler();
    local_4 = -1;
  }
  local_13c = (uint)bVar1;
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_e8);
  if (local_13c == 0) {
    peVar4 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1082f1);
    local_140 = nuraft::srv_config::get_id(peVar4);
    peVar4 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10831d);
    local_144 = nuraft::srv_config::get_id(peVar4);
    if (local_140 == local_144) {
      local_4 = 0;
      local_13c = 1;
    }
    else {
      poVar6 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"        time: ");
      poVar6 = std::operator<<(poVar6,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar6 = std::operator<<(poVar6,local_168);
      poVar6 = std::operator<<(poVar6,"\x1b[0m");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"      thread: ");
      poVar6 = std::operator<<(poVar6,"\x1b[33m");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
      _Var3 = std::setw(4);
      poVar6 = std::operator<<(poVar6,_Var3);
      _Var2 = std::setfill<char>('0');
      poVar6 = std::operator<<(poVar6,_Var2._M_c);
      std::this_thread::get_id();
      sVar7 = std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)in_stack_fffffffffffffc20,
                         (id *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      pvVar8 = (void *)std::ostream::operator<<(poVar6,sVar7 & 0xffff);
      poVar6 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
      poVar6 = std::operator<<(poVar6,"\x1b[0m");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"          in: ");
      poVar6 = std::operator<<(poVar6,"\x1b[36m");
      poVar6 = std::operator<<(poVar6,"srv_config_test");
      poVar6 = std::operator<<(poVar6,"()\x1b[0m");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"          at: ");
      poVar6 = std::operator<<(poVar6,"\x1b[32m");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/serialization_test.cxx"
                              );
      poVar6 = std::operator<<(poVar6,"\x1b[0m:");
      poVar6 = std::operator<<(poVar6,"\x1b[1;35m");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x39);
      poVar6 = std::operator<<(poVar6,"\x1b[0m");
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"    value of: \x1b[1;34msrv_conf1->get_id()\x1b[0m\n");
      poVar6 = std::operator<<(poVar6,"    expected: \x1b[1;32m");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_140);
      poVar6 = std::operator<<(poVar6,"\x1b[0m\n");
      poVar6 = std::operator<<(poVar6,"      actual: \x1b[1;31m");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_144);
      std::operator<<(poVar6,"\x1b[0m\n");
      std::__cxx11::string::~string(local_168);
      TestSuite::failHandler();
      local_4 = -1;
      local_13c = 1;
    }
  }
  std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x108806);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x108813);
  std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x108820);
  return local_4;
}

Assistant:

int srv_config_test() {
    ptr<srv_config> srv_conf
                    ( cs_new<srv_config>
                      ( rnd(),
                        sstrfmt("server %d").fmt( rnd() ) ) );
    ptr<buffer> srv_conf_buf( srv_conf->serialize() );

    ptr<srv_config> srv_conf1( srv_config::deserialize(*srv_conf_buf) );

    CHK_EQ( srv_conf->get_endpoint(), srv_conf1->get_endpoint() );
    CHK_EQ( srv_conf->get_id(), srv_conf1->get_id() );

    return 0;
}